

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O3

void relative16_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  long lVar1;
  byte bVar2;
  ushort uVar3;
  cs_detail *pcVar4;
  short sVar5;
  long lVar6;
  
  uVar3 = *address;
  lVar6 = (ulong)uVar3 - (ulong)info->offset;
  lVar1 = lVar6 + 1;
  if ((uint)lVar1 < info->size) {
    sVar5 = CONCAT11(info->code[lVar6],info->code[lVar1]);
  }
  else {
    sVar5 = 0;
  }
  *address = uVar3 + 2;
  bVar2 = (info->m680x).op_count;
  (info->m680x).op_count = bVar2 + 1;
  (info->m680x).operands[bVar2].type = M680X_OP_RELATIVE;
  (info->m680x).operands[bVar2].size = '\0';
  (info->m680x).operands[bVar2].field_1.rel.offset = sVar5;
  (info->m680x).operands[bVar2].field_1.rel.address = uVar3 + sVar5 + 2;
  pcVar4 = MI->flat_insn->detail;
  if (pcVar4 != (cs_detail *)0x0) {
    bVar2 = pcVar4->groups_count;
    pcVar4->groups_count = bVar2 + 1;
    pcVar4->groups[bVar2] = '\a';
  }
  if (info->insn - M680X_INS_LBRA < 3) {
    return;
  }
  add_reg_to_rw_list((MCInst *)MI->flat_insn->detail,M680X_REG_CC,READ);
  return;
}

Assistant:

static void relative16_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	uint16_t offset = 0;

	read_word(info, &offset, *address);
	*address += 2;
	add_rel_operand(info, (int16_t)offset, *address + offset);
	add_insn_group(MI->flat_insn->detail, M680X_GRP_BRAREL);

	if ((info->insn != M680X_INS_LBRA) &&
		(info->insn != M680X_INS_LBSR) &&
		(info->insn != M680X_INS_LBRN))
		add_reg_to_rw_list(MI, M680X_REG_CC, READ);
}